

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_hint_align(PSH_Hint_conflict hint,PSH_Globals globals,FT_Int dimension,PSH_Glyph glyph)

{
  PSH_Hint_conflict hint_00;
  long lVar1;
  long lVar2;
  FT_Int32 FVar3;
  PSH_Dimension dim_00;
  ulong uVar4;
  ulong uVar5;
  FT_Fixed FVar6;
  long lVar7;
  FT_Int32 b;
  bool bVar8;
  long local_c0;
  FT_Pos right_disp;
  FT_Pos left_disp;
  FT_Pos right_nearest;
  FT_Pos left_nearest;
  FT_Pos cur_delta;
  FT_Pos cur_org_center;
  FT_Pos par_cur_center;
  FT_Pos par_org_center;
  PSH_Hint_conflict parent;
  PSH_AlignmentRec align;
  FT_Pos fit_len;
  ulong uStack_50;
  FT_Int do_snapping;
  FT_Pos len;
  FT_Pos pos;
  FT_Fixed delta;
  FT_Fixed scale;
  PSH_Dimension dim;
  PSH_Glyph glyph_local;
  FT_Int dimension_local;
  PSH_Globals globals_local;
  PSH_Hint_conflict hint_local;
  
  dim_00 = globals->dimension + dimension;
  lVar7 = dim_00->scale_delta;
  if ((hint->flags & 8) == 0) {
    b = (FT_Int32)dim_00->scale_mult;
    FVar3 = FT_MulFix_x86_64(hint->org_pos,b);
    len = FVar3 + lVar7;
    FVar3 = FT_MulFix_x86_64(hint->org_len,b);
    uStack_50 = (ulong)FVar3;
    if (((dimension == 0) && (glyph->do_horz_hints == '\0')) ||
       ((dimension == 1 && (glyph->do_vert_hints == '\0')))) {
      hint->cur_pos = len;
      hint->cur_len = uStack_50;
      hint->flags = hint->flags | 8;
    }
    else {
      if (((dimension != 0) || (bVar8 = true, glyph->do_horz_snapping == '\0')) &&
         (bVar8 = false, dimension == 1)) {
        bVar8 = glyph->do_vert_snapping != '\0';
      }
      hint->cur_len = uStack_50;
      parent._0_4_ = 0;
      align.align = 0;
      align._4_4_ = 0;
      align.align_top = 0;
      align.align_bot = uStack_50;
      if (dimension == 1) {
        psh_blues_snap_stem(&globals->blues,hint->org_pos + hint->org_len,hint->org_pos,
                            (PSH_Alignment)&parent);
      }
      if ((int)parent == 1) {
        hint->cur_pos = align._0_8_ - align.align_bot;
      }
      else if ((int)parent == 2) {
        hint->cur_pos = align.align_top;
      }
      else if ((int)parent == 3) {
        hint->cur_pos = align.align_top;
        hint->cur_len = align._0_8_ - align.align_top;
      }
      else {
        hint_00 = hint->parent;
        lVar7 = (long)uStack_50 >> 1;
        if (hint_00 != (PSH_Hint_conflict)0x0) {
          if ((hint_00->flags & 8) == 0) {
            psh_hint_align(hint_00,globals,dimension,glyph);
          }
          lVar1 = hint_00->cur_pos;
          lVar2 = hint_00->cur_len;
          FVar3 = FT_MulFix_x86_64((hint->org_pos + (hint->org_len >> 1)) -
                                   (hint_00->org_pos + (hint_00->org_len >> 1)),b);
          len = (lVar1 + (lVar2 >> 1) + (long)FVar3) - lVar7;
        }
        hint->cur_pos = len;
        hint->cur_len = align.align_bot;
        if (glyph->do_stem_adjust != '\0') {
          if ((long)uStack_50 < 0x41) {
            if ((long)uStack_50 < 0x20) {
              if ((long)uStack_50 < 1) {
                len = len + 0x20U & 0xffffffffffffffc0;
              }
              else {
                uVar4 = len + 0x20U & 0xffffffffffffffc0;
                uVar5 = len + uStack_50 + 0x20 & 0xffffffffffffffc0;
                right_disp = uVar4 - len;
                local_c0 = uVar5 - (len + uStack_50);
                if (right_disp < 0) {
                  right_disp = -right_disp;
                }
                if (local_c0 < 0) {
                  local_c0 = -local_c0;
                }
                len = uVar5;
                if (right_disp <= local_c0) {
                  len = uVar4;
                }
              }
            }
            else {
              uStack_50 = 0x40;
              len = len + lVar7 & 0xffffffffffffffc0;
            }
          }
          else {
            uStack_50 = psh_dimension_quantize_len(dim_00,uStack_50,'\0');
          }
        }
        FVar6 = psh_hint_snap_stem_side_delta(len,uStack_50);
        hint->cur_pos = len + FVar6;
        hint->cur_len = uStack_50;
      }
      if (bVar8) {
        if (hint->cur_len < 0x40) {
          uStack_50 = 0x40;
        }
        else {
          uStack_50 = hint->cur_len + 0x20U & 0xffffffffffffffc0;
        }
        if ((int)parent == 1) {
          hint->cur_pos = align._0_8_ - uStack_50;
          hint->cur_len = uStack_50;
        }
        else if ((int)parent == 2) {
          hint->cur_len = uStack_50;
        }
        else if ((int)parent != 3) {
          hint->cur_len = uStack_50;
          lVar7 = (long)uStack_50 >> 1;
          if ((uStack_50 & 0x40) == 0) {
            len = hint->cur_pos + lVar7 + 0x20U & 0xffffffffffffffc0;
          }
          else {
            len = (hint->cur_pos + lVar7 & 0xffffffffffffffc0U) + 0x20;
          }
          hint->cur_pos = len - lVar7;
          hint->cur_len = uStack_50;
        }
      }
      hint->flags = hint->flags | 8;
    }
  }
  return;
}

Assistant:

static void
  psh_hint_align( PSH_Hint     hint,
                  PSH_Globals  globals,
                  FT_Int       dimension,
                  PSH_Glyph    glyph )
  {
    PSH_Dimension  dim   = &globals->dimension[dimension];
    FT_Fixed       scale = dim->scale_mult;
    FT_Fixed       delta = dim->scale_delta;


    if ( !psh_hint_is_fitted( hint ) )
    {
      FT_Pos  pos = FT_MulFix( hint->org_pos, scale ) + delta;
      FT_Pos  len = FT_MulFix( hint->org_len, scale );

      FT_Int            do_snapping;
      FT_Pos            fit_len;
      PSH_AlignmentRec  align;


      /* ignore stem alignments when requested through the hint flags */
      if ( ( dimension == 0 && !glyph->do_horz_hints ) ||
           ( dimension == 1 && !glyph->do_vert_hints ) )
      {
        hint->cur_pos = pos;
        hint->cur_len = len;

        psh_hint_set_fitted( hint );
        return;
      }

      /* perform stem snapping when requested - this is necessary
       * for monochrome and LCD hinting modes only
       */
      do_snapping = ( dimension == 0 && glyph->do_horz_snapping ) ||
                    ( dimension == 1 && glyph->do_vert_snapping );

      hint->cur_len = fit_len = len;

      /* check blue zones for horizontal stems */
      align.align     = PSH_BLUE_ALIGN_NONE;
      align.align_bot = align.align_top = 0;

      if ( dimension == 1 )
        psh_blues_snap_stem( &globals->blues,
                             hint->org_pos + hint->org_len,
                             hint->org_pos,
                             &align );

      switch ( align.align )
      {
      case PSH_BLUE_ALIGN_TOP:
        /* the top of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_top - fit_len;
        break;

      case PSH_BLUE_ALIGN_BOT:
        /* the bottom of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_bot;
        break;

      case PSH_BLUE_ALIGN_TOP | PSH_BLUE_ALIGN_BOT:
        /* both edges of the stem are aligned against blue zones */
        hint->cur_pos = align.align_bot;
        hint->cur_len = align.align_top - align.align_bot;
        break;

      default:
        {
          PSH_Hint  parent = hint->parent;


          if ( parent )
          {
            FT_Pos  par_org_center, par_cur_center;
            FT_Pos  cur_org_center, cur_delta;


            /* ensure that parent is already fitted */
            if ( !psh_hint_is_fitted( parent ) )
              psh_hint_align( parent, globals, dimension, glyph );

            /* keep original relation between hints, this is, use the */
            /* scaled distance between the centers of the hints to    */
            /* compute the new position                               */
            par_org_center = parent->org_pos + ( parent->org_len >> 1 );
            par_cur_center = parent->cur_pos + ( parent->cur_len >> 1 );
            cur_org_center = hint->org_pos   + ( hint->org_len   >> 1 );

            cur_delta = FT_MulFix( cur_org_center - par_org_center, scale );
            pos       = par_cur_center + cur_delta - ( len >> 1 );
          }

          hint->cur_pos = pos;
          hint->cur_len = fit_len;

          /* Stem adjustment tries to snap stem widths to standard
           * ones.  This is important to prevent unpleasant rounding
           * artefacts.
           */
          if ( glyph->do_stem_adjust )
          {
            if ( len <= 64 )
            {
              /* the stem is less than one pixel; we will center it
               * around the nearest pixel center
               */
              if ( len >= 32 )
              {
                /* This is a special case where we also widen the stem
                 * and align it to the pixel grid.
                 *
                 *   stem_center          = pos + (len/2)
                 *   nearest_pixel_center = FT_ROUND(stem_center-32)+32
                 *   new_pos              = nearest_pixel_center-32
                 *                        = FT_ROUND(stem_center-32)
                 *                        = FT_FLOOR(stem_center-32+32)
                 *                        = FT_FLOOR(stem_center)
                 *   new_len              = 64
                 */
                pos = FT_PIX_FLOOR( pos + ( len >> 1 ) );
                len = 64;
              }
              else if ( len > 0 )
              {
                /* This is a very small stem; we simply align it to the
                 * pixel grid, trying to find the minimum displacement.
                 *
                 * left               = pos
                 * right              = pos + len
                 * left_nearest_edge  = ROUND(pos)
                 * right_nearest_edge = ROUND(right)
                 *
                 * if ( ABS(left_nearest_edge - left) <=
                 *      ABS(right_nearest_edge - right) )
                 *    new_pos = left
                 * else
                 *    new_pos = right
                 */
                FT_Pos  left_nearest  = FT_PIX_ROUND( pos );
                FT_Pos  right_nearest = FT_PIX_ROUND( pos + len );
                FT_Pos  left_disp     = left_nearest - pos;
                FT_Pos  right_disp    = right_nearest - ( pos + len );


                if ( left_disp < 0 )
                  left_disp = -left_disp;
                if ( right_disp < 0 )
                  right_disp = -right_disp;
                if ( left_disp <= right_disp )
                  pos = left_nearest;
                else
                  pos = right_nearest;
              }
              else
              {
                /* this is a ghost stem; we simply round it */
                pos = FT_PIX_ROUND( pos );
              }
            }
            else
            {
              len = psh_dimension_quantize_len( dim, len, 0 );
            }
          }

          /* now that we have a good hinted stem width, try to position */
          /* the stem along a pixel grid integer coordinate             */
          hint->cur_pos = pos + psh_hint_snap_stem_side_delta( pos, len );
          hint->cur_len = len;
        }
      }

      if ( do_snapping )
      {
        pos = hint->cur_pos;
        len = hint->cur_len;

        if ( len < 64 )
          len = 64;
        else
          len = FT_PIX_ROUND( len );

        switch ( align.align )
        {
          case PSH_BLUE_ALIGN_TOP:
            hint->cur_pos = align.align_top - len;
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT:
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT | PSH_BLUE_ALIGN_TOP:
            /* don't touch */
            break;


          default:
            hint->cur_len = len;
            if ( len & 64 )
              pos = FT_PIX_FLOOR( pos + ( len >> 1 ) ) + 32;
            else
              pos = FT_PIX_ROUND( pos + ( len >> 1 ) );

            hint->cur_pos = pos - ( len >> 1 );
            hint->cur_len = len;
        }
      }

      psh_hint_set_fitted( hint );

#ifdef DEBUG_HINTER
      if ( ps_debug_hint_func )
        ps_debug_hint_func( hint, dimension );
#endif
    }
  }